

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent(InMemoryDirectory *this,StringPtr name)

{
  Impl **this_00;
  InMemoryDirectory *pIVar1;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_00;
  EntryImpl *entry;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar3;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Mutex *local_68;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_60;
  InMemoryDirectory *local_58;
  undefined8 local_48;
  undefined1 local_40 [16];
  ReadableDirectory *pRVar2;
  
  name_00.content.size_ = name.content.size_;
  lock_00 = (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)name.content.ptr;
  this_00 = &lock_00[1].ptr;
  local_40[0] = '\0';
  local_58 = this;
  _::Mutex::lock((Mutex *)this_00,1,local_40);
  local_40[0] = '\0';
  local_68 = (Mutex *)this_00;
  local_60 = lock_00 + 3;
  _::Mutex::lock((Mutex *)this_00,1,local_40);
  name_00.content.ptr = (char *)(lock_00 + 3);
  Impl::tryGetEntry((Impl *)&stack0xffffffffffffffb8,name_00);
  _::Mutex::unlock((Mutex *)this_00,SHARED,(Waiter *)0x0);
  pIVar1 = local_58;
  if (local_48 == 0) {
    (local_58->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)0x0;
    (local_58->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    pRVar2 = extraout_RDX;
  }
  else {
    MVar3 = asDirectory(local_58,lock_00,(EntryImpl *)&local_68);
    pRVar2 = MVar3.ptr.ptr;
  }
  if (local_68 != (Mutex *)0x0) {
    _::Mutex::unlock(local_68,SHARED,(Waiter *)0x0);
    pRVar2 = extraout_RDX_00;
  }
  MVar3.ptr.ptr = pRVar2;
  MVar3.ptr.disposer = (Disposer *)pIVar1;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<Own<const ReadableDirectory>> tryGetParent(kj::StringPtr name) const {
    auto lock = impl.lockShared();
    KJ_IF_SOME(entry, impl.lockShared()->tryGetEntry(name)) {
      return asDirectory(lock, entry);
    } else {
      return kj::none;
    }
  }